

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

UObject * __thiscall
icu_63::ICUCollatorService::handleDefault
          (ICUCollatorService *this,ICUServiceKey *key,UnicodeString *actualID,UErrorCode *status)

{
  UObject *pUVar1;
  undefined1 local_110 [8];
  Locale loc;
  LocaleKey *lkey;
  UErrorCode *status_local;
  UnicodeString *actualID_local;
  ICUServiceKey *key_local;
  ICUCollatorService *this_local;
  
  loc._216_8_ = key;
  if (actualID != (UnicodeString *)0x0) {
    UnicodeString::truncate(actualID,(char *)0x0,(__off_t)actualID);
  }
  Locale::Locale((Locale *)local_110,"",(char *)0x0,(char *)0x0,(char *)0x0);
  (**(code **)(*(long *)loc._216_8_ + 0x58))(loc._216_8_,(Locale *)local_110);
  pUVar1 = &Collator::makeInstance((Locale *)local_110,status)->super_UObject;
  Locale::~Locale((Locale *)local_110);
  return pUVar1;
}

Assistant:

virtual UObject* handleDefault(const ICUServiceKey& key, UnicodeString* actualID, UErrorCode& status) const {
        LocaleKey& lkey = (LocaleKey&)key;
        if (actualID) {
            // Ugly Hack Alert! We return an empty actualID to signal
            // to callers that this is a default object, not a "real"
            // service-created object. (TODO remove in 3.0) [aliu]
            actualID->truncate(0);
        }
        Locale loc("");
        lkey.canonicalLocale(loc);
        return Collator::makeInstance(loc, status);
    }